

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<TestCountExpr>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,TestCountExpr>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
                *matchers,tuple<mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr> *values,ostream *os
               )

{
  bool bVar1;
  StringMatchResultListener *this;
  ostream *in_RDX;
  tuple<mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr> *in_RSI;
  tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
  *in_RDI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  Matcher<mp::expr::Kind> *in_stack_fffffffffffffde8;
  Kind x;
  StringMatchResultListener *in_stack_fffffffffffffdf0;
  string local_200 [16];
  StringMatchResultListener *in_stack_fffffffffffffe10;
  
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<TestCountExpr>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,TestCountExpr>>
            (in_RDI,in_RSI,in_RDX);
  std::
  get<0ul,testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<TestCountExpr>>
            ((tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
              *)0x2ccc59);
  Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  x = (Kind)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  std::get<0ul,mp::expr::Kind,BasicTestExpr<1>,TestCountExpr>
            ((tuple<mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr> *)0x2ccc76);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe10);
  bVar1 = MatcherBase<mp::expr::Kind>::MatchAndExplain
                    ((MatcherBase<mp::expr::Kind> *)in_stack_fffffffffffffdf0,x,
                     (MatchResultListener *)0x2ccca4);
  if (!bVar1) {
    in_stack_fffffffffffffdf0 =
         (StringMatchResultListener *)std::operator<<(in_RDX,"  Expected arg #");
    this = (StringMatchResultListener *)std::ostream::operator<<(in_stack_fffffffffffffdf0,0);
    std::operator<<((ostream *)this,": ");
    std::
    get<0ul,testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<TestCountExpr>>
              ((tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
                *)0x2ccd06);
    MatcherBase<mp::expr::Kind>::DescribeTo
              ((MatcherBase<mp::expr::Kind> *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::operator<<(in_RDX,"\n           Actual: ");
    UniversalPrint<mp::expr::Kind>((Kind *)in_stack_fffffffffffffdf0,(ostream *)this);
    StringMatchResultListener::str_abi_cxx11_(this);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::__cxx11::string::~string(local_200);
    std::operator<<(in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdf0);
  Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x2ccddd);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }